

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

int lo0bits(ULong *y)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  uVar3 = *y;
  if ((uVar3 & 7) == 0) {
    bVar5 = (uVar3 & 0xfff8) == 0;
    uVar1 = uVar3 >> 0x10;
    if (!bVar5) {
      uVar1 = uVar3;
    }
    iVar4 = (uint)bVar5 * 0x10;
    uVar3 = uVar1 >> 8;
    iVar2 = iVar4 + 8;
    if ((char)uVar1 != '\0') {
      uVar3 = uVar1;
      iVar2 = iVar4;
    }
    uVar1 = uVar3 >> 4;
    iVar4 = iVar2 + 4;
    if ((uVar3 & 0xf) != 0) {
      uVar1 = uVar3;
      iVar4 = iVar2;
    }
    uVar3 = uVar1 >> 2;
    iVar2 = iVar4 + 2;
    if ((uVar1 & 3) != 0) {
      uVar3 = uVar1;
      iVar2 = iVar4;
    }
    if ((uVar3 & 1) == 0) {
      if (uVar3 == 0) {
        return 0x20;
      }
      iVar2 = iVar2 + 1;
      uVar3 = uVar3 >> 1;
    }
  }
  else {
    if ((uVar3 & 1) != 0) {
      return 0;
    }
    if ((uVar3 & 2) == 0) {
      uVar3 = uVar3 >> 2;
      iVar2 = 2;
    }
    else {
      uVar3 = uVar3 >> 1;
      iVar2 = 1;
    }
  }
  *y = uVar3;
  return iVar2;
}

Assistant:

static int
lo0bits(ULong *y)
{
	int k;
	ULong x = *y;

	if (x & 7) {
		if (x & 1)
			return 0;
		if (x & 2) {
			*y = x >> 1;
			return 1;
			}
		*y = x >> 2;
		return 2;
		}
	k = 0;
	if (!(x & 0xffff)) {
		k = 16;
		x >>= 16;
		}
	if (!(x & 0xff)) {
		k += 8;
		x >>= 8;
		}
	if (!(x & 0xf)) {
		k += 4;
		x >>= 4;
		}
	if (!(x & 0x3)) {
		k += 2;
		x >>= 2;
		}
	if (!(x & 1)) {
		k++;
		x >>= 1;
		if (!x)
			return 32;
		}
	*y = x;
	return k;
	}